

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::
emplace<std::pair<unsigned_int,QMetaObject_const*>const&>
          (iterator *__return_storage_ptr__,
          QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *this,QObject **key,
          pair<unsigned_int,_const_QMetaObject_*> *args)

{
  Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_> *pDVar1;
  long in_FS_OFFSET;
  QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
             **)this;
  if (pDVar1 == (Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
                 *)0x0) {
    local_38.d = (Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
                  *)0x0;
    local_38.m_size = *(qsizetype *)(this + 8);
LAB_00588afc:
    pDVar1 = (Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
              *)0x0;
LAB_00588b28:
    pDVar1 = QHashPrivate::
             Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
             ::detached(pDVar1);
    *(Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_> **)
     this = pDVar1;
LAB_00588b31:
    emplace_helper<std::pair<unsigned_int,QMetaObject_const*>const&>
              (__return_storage_ptr__,this,key,args);
    QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>::~QMultiHash(&local_38);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_38.m_size = *(qsizetype *)(this + 8);
      local_38.d = pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
                   **)this;
        if (pDVar1 == (Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
                       *)0x0) goto LAB_00588afc;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_00588b28;
      goto LAB_00588b31;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        emplace_helper<std::pair<unsigned_int,QMetaObject_const*>const&>
                  (__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_00588b83;
    }
    local_38.d = *(Data **)args;
    local_38.m_size = (qsizetype)args->second;
    emplace_helper<std::pair<unsigned_int,QMetaObject_const*>>
              (__return_storage_ptr__,this,key,(pair<unsigned_int,_const_QMetaObject_*> *)&local_38)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_00588b83:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }